

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

void ZSTD_checkDictValidity
               (ZSTD_window_t *window,void *blockEnd,U32 maxDist,U32 *loadedDictEndPtr,
               ZSTD_matchState_t **dictMatchStatePtr)

{
  U32 loadedDictEnd;
  U32 blockEndIdx;
  ZSTD_matchState_t **dictMatchStatePtr_local;
  U32 *loadedDictEndPtr_local;
  U32 maxDist_local;
  void *blockEnd_local;
  ZSTD_window_t *window_local;
  
  if (*loadedDictEndPtr + maxDist < (uint)((int)blockEnd - (int)window->base)) {
    *loadedDictEndPtr = 0;
    *dictMatchStatePtr = (ZSTD_matchState_t *)0x0;
  }
  return;
}

Assistant:

MEM_STATIC void
ZSTD_checkDictValidity(const ZSTD_window_t* window,
                       const void* blockEnd,
                             U32   maxDist,
                             U32*  loadedDictEndPtr,
                       const ZSTD_matchState_t** dictMatchStatePtr)
{
    assert(loadedDictEndPtr != NULL);
    assert(dictMatchStatePtr != NULL);
    {   U32 const blockEndIdx = (U32)((BYTE const*)blockEnd - window->base);
        U32 const loadedDictEnd = *loadedDictEndPtr;
        DEBUGLOG(5, "ZSTD_checkDictValidity: blockEndIdx=%u, maxDist=%u, loadedDictEnd=%u",
                    (unsigned)blockEndIdx, (unsigned)maxDist, (unsigned)loadedDictEnd);
        assert(blockEndIdx >= loadedDictEnd);

        if (blockEndIdx > loadedDictEnd + maxDist) {
            /* On reaching window size, dictionaries are invalidated.
             * For simplification, if window size is reached anywhere within next block,
             * the dictionary is invalidated for the full block.
             */
            DEBUGLOG(6, "invalidating dictionary for current block (distance > windowSize)");
            *loadedDictEndPtr = 0;
            *dictMatchStatePtr = NULL;
        } else {
            if (*loadedDictEndPtr != 0) {
                DEBUGLOG(6, "dictionary considered valid for current block");
    }   }   }
}